

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

optional<int> GetScriptNumber(opcodetype opcode,valtype *data,int min,int max)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  CScriptNum CVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  CScriptNum local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (opcode - OP_1 < 0x10) {
    uVar2 = opcode - OP_RESERVED;
    if (opcode == OP_0) {
      uVar2 = 0;
    }
LAB_003efca9:
    uVar5 = (ulong)((int)uVar2 <= max && min <= (int)uVar2) << 0x20;
    uVar3 = (ulong)uVar2;
  }
  else {
    if (opcode + ~OP_0 < 0x4e) {
      bVar1 = CheckMinimalPush(data,opcode);
      if (bVar1) {
        CScriptNum::CScriptNum(&local_28,data,true,4);
        CVar4.m_value = -0x80000000;
        if (-0x80000000 < local_28.m_value) {
          CVar4.m_value = local_28.m_value;
        }
        if (0x7ffffffe < CVar4.m_value) {
          CVar4.m_value = 0x7fffffff;
        }
        uVar2 = (uint)CVar4.m_value;
        goto LAB_003efca9;
      }
    }
    uVar5 = 0;
    uVar3 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (optional<int>)(uVar3 | uVar5);
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<int> GetScriptNumber(opcodetype opcode, valtype data, int min, int max)
{
    int count;
    if (IsSmallInteger(opcode)) {
        count = CScript::DecodeOP_N(opcode);
    } else if (IsPushdataOp(opcode)) {
        if (!CheckMinimalPush(data, opcode)) return {};
        try {
            count = CScriptNum(data, /* fRequireMinimal = */ true).getint();
        } catch (const scriptnum_error&) {
            return {};
        }
    } else {
        return {};
    }
    if (count < min || count > max) return {};
    return count;
}